

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_convert_tile_tuint
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if ((((zbitpix != 0x20) || (scale != 1.0)) || (NAN(scale))) ||
     ((zero != 2147483648.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar3 = 0x19d;
  }
  else {
    *intlength = 4;
    if (nullcheck == 1) {
      if (0 < tilelen) {
        iVar3 = *nullflagval;
        lVar4 = tilelen + 1;
        do {
          iVar2 = *(int *)((long)tiledata + lVar4 * 4 + -8);
          iVar5 = iVar2 + -0x80000000;
          if (iVar2 == iVar3) {
            iVar5 = nullval;
          }
          *(int *)((long)tiledata + lVar4 * 4 + -8) = iVar5;
          lVar4 = lVar4 + -1;
        } while (1 < lVar4);
      }
    }
    else if (0 < tilelen) {
      lVar4 = tilelen + 1;
      do {
        pbVar1 = (byte *)((long)tiledata + lVar4 * 4 + -5);
        *pbVar1 = *pbVar1 ^ 0x80;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int imcomp_convert_tile_tuint(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input unsigned integer tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, do null value substitution. */


    int *idata;
    unsigned int *uintbuff, uintflagval;
    long ii;
 
       /* datatype of input array is unsigned int.  We only support writing this datatype
          to a FITS image with BITPIX = 32 and with BZERO = 0 and BSCALE = 2147483648.  */

       if (zbitpix != LONG_IMG || scale != 1.0 || zero != 2147483648.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       *intlength = 4;
       idata = (int *) tiledata;
       uintbuff = (unsigned int *) tiledata;

       /* offset the unsigned value by -2147483648 to a signed int value. */
       /* It is more efficient to do this by just flipping the most significant of the 32 bits */

       if (nullcheck == 1) {
               /* reset pixels equal to flagval to nullval and */
               /* offset the other pixel values (by flipping the MSB) */
               uintflagval = *(unsigned int *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (uintbuff[ii] == uintflagval)
		       idata[ii] = nullval;
                    else
		       uintbuff[ii] = (uintbuff[ii]) ^ 0x80000000;
               }
       } else {
               /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--)
		       uintbuff[ii] = (uintbuff[ii]) ^ 0x80000000;
       }

       return(*status);
}